

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_interpolate.cpp
# Opt level: O1

void __thiscall
DSectorScrollInterpolation::Serialize(DSectorScrollInterpolation *this,FSerializer *arc)

{
  FSerializer *pFVar1;
  
  DInterpolation::Serialize(&this->super_DInterpolation,arc);
  pFVar1 = Serialize<sector_t>(arc,"sector",&this->sector,(sector_t_conflict **)0x0);
  pFVar1 = ::Serialize(pFVar1,"ceiling",&this->ceiling,(bool *)0x0);
  pFVar1 = ::Serialize(pFVar1,"oldx",&this->oldx,(double *)0x0);
  ::Serialize(pFVar1,"oldy",&this->oldy,(double *)0x0);
  return;
}

Assistant:

void DSectorScrollInterpolation::Serialize(FSerializer &arc)
{
	Super::Serialize(arc);
	arc("sector", sector)
		("ceiling", ceiling)
		("oldx", oldx)
		("oldy", oldy);
}